

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_event.cpp
# Opt level: O1

void __thiscall sc_core::sc_event_list::add_dynamic(sc_event_list *this,sc_thread_handle thread_h)

{
  long lVar1;
  iterator __position;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  sc_event **l_events;
  sc_thread_handle local_28;
  
  *(int *)(this + 0x1c) = *(int *)(this + 0x1c) + 1;
  lVar1 = *(long *)this;
  uVar4 = *(long *)(this + 8) - lVar1;
  if ((uVar4 != 0) && (uVar3 = (int)(uVar4 >> 3) - 1, -1 < (int)uVar3)) {
    lVar5 = (ulong)uVar3 + 1;
    do {
      lVar6 = *(long *)(lVar1 + -8 + lVar5 * 8);
      __position._M_current = *(sc_thread_process ***)(lVar6 + 0x98);
      if (__position._M_current == *(sc_thread_process ***)(lVar6 + 0xa0)) {
        local_28 = thread_h;
        std::vector<sc_core::sc_thread_process_*,_std::allocator<sc_core::sc_thread_process_*>_>::
        _M_realloc_insert((vector<sc_core::sc_thread_process_*,_std::allocator<sc_core::sc_thread_process_*>_>
                           *)(lVar6 + 0x90),__position,&local_28);
      }
      else {
        *__position._M_current = thread_h;
        *(long *)(lVar6 + 0x98) = *(long *)(lVar6 + 0x98) + 8;
      }
      lVar6 = lVar5 + -1;
      bVar2 = 0 < lVar5;
      lVar5 = lVar6;
    } while (lVar6 != 0 && bVar2);
  }
  return;
}

Assistant:

void
sc_event_list::add_dynamic( sc_thread_handle thread_h ) const
{
    m_busy++;
    if ( m_events.size() != 0 ) {
      const sc_event* const* l_events = &m_events[0];
      for( int i = m_events.size() - 1; i >= 0; -- i ) {
          l_events[i]->add_dynamic( thread_h );
      }
  }
}